

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiID *pIVar1;
  float fVar2;
  ImVec2 IVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiID IVar7;
  ImGuiContext *pIVar8;
  ImGuiContext *g;
  ImVec2 pos;
  ImVec2 local_18;
  
  pIVar5 = GImGui;
  pIVar4 = GImGui->MovingWindow;
  if (pIVar4 == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    IVar7 = GImGui->ActiveIdWindow->MoveId;
    if (IVar7 != GImGui->ActiveId) {
      return;
    }
    GImGui->ActiveIdIsAlive = IVar7;
    if (pIVar5->ActiveIdPreviousFrame == IVar7) {
      pIVar5->ActiveIdPreviousFrameIsAlive = true;
    }
    if ((pIVar5->IO).MouseDown[0] != false) {
      return;
    }
    pIVar5->ActiveIdIsJustActivated = IVar7 != 0;
    if (IVar7 != 0) {
      pIVar5->ActiveIdTimer = 0.0;
      pIVar5->ActiveIdHasBeenPressedBefore = false;
      pIVar5->ActiveIdHasBeenEditedBefore = false;
    }
    pIVar5->ActiveId = 0;
    pIVar5->ActiveIdAllowNavDirFlags = 0;
    pIVar5->ActiveIdBlockNavInputFlags = 0;
    pIVar5->ActiveIdAllowOverlap = false;
    pIVar5->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar5->ActiveIdHasBeenEditedThisFrame = false;
    return;
  }
  IVar7 = GImGui->ActiveId;
  pIVar1 = &GImGui->ActiveIdPreviousFrame;
  GImGui->ActiveIdIsAlive = IVar7;
  if (*pIVar1 == IVar7) {
    pIVar5->ActiveIdPreviousFrameIsAlive = true;
  }
  pIVar4 = pIVar4->RootWindow;
  if (pIVar4 == (ImGuiWindow *)0x0) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui.cpp"
                  ,0xd2a,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  pIVar8 = pIVar5;
  if ((pIVar5->IO).MouseDown[0] != true) {
LAB_00362c56:
    pIVar8->ActiveIdIsJustActivated = IVar7 != 0;
    if (IVar7 != 0) {
      pIVar8->ActiveIdTimer = 0.0;
      pIVar8->ActiveIdHasBeenPressedBefore = false;
      pIVar8->ActiveIdHasBeenEditedBefore = false;
    }
    pIVar8->ActiveId = 0;
    pIVar8->ActiveIdAllowNavDirFlags = 0;
    pIVar8->ActiveIdBlockNavInputFlags = 0;
    pIVar8->ActiveIdAllowOverlap = false;
    pIVar8->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar8->ActiveIdHasBeenEditedThisFrame = false;
    pIVar5->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  bVar6 = IsMousePosValid(&(pIVar5->IO).MousePos);
  if (!bVar6) {
    IVar7 = GImGui->ActiveId;
    pIVar8 = GImGui;
    goto LAB_00362c56;
  }
  IVar3 = (pIVar5->IO).MousePos;
  local_18.x = IVar3.x - (pIVar5->ActiveIdClickOffset).x;
  local_18.y = IVar3.y - (pIVar5->ActiveIdClickOffset).y;
  fVar2 = (pIVar4->Pos).x;
  if ((fVar2 == local_18.x) && (!NAN(fVar2) && !NAN(local_18.x))) {
    fVar2 = (pIVar4->Pos).y;
    if ((fVar2 == local_18.y) && (!NAN(fVar2) && !NAN(local_18.y))) goto LAB_00362ba6;
  }
  if (((pIVar4->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
    GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
  }
  SetWindowPos(pIVar4,&local_18,1);
LAB_00362ba6:
  FocusWindow(pIVar5->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}